

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

double __thiscall chrono::robosimian::RS_Limb::GetMass(RS_Limb *this)

{
  __node_base *p_Var1;
  value_type link;
  double local_48;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
  local_40;
  
  p_Var1 = &(this->m_links)._M_h._M_before_begin;
  local_48 = 0.0;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
    ::pair(&local_40,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
            *)(p_Var1 + 1));
    local_48 = local_48 +
               *(double *)
                (((local_40.second.
                   super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_body).
                 super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x2e8
                );
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
    ::~pair(&local_40);
  }
  return local_48;
}

Assistant:

double RS_Limb::GetMass() const {
    double mass = 0;
    for (auto link : m_links)
        mass += link.second->m_body->GetMass();
    return mass;
}